

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuarticBendType.hpp
# Opt level: O3

void __thiscall
OpenMD::QuarticBendType::calcForce
          (QuarticBendType *this,RealType theta,RealType *V,RealType *dVdTheta)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = theta - (this->super_BendType).theta0_;
  dVar3 = dVar1 * dVar1;
  dVar2 = dVar1 * dVar3;
  *V = dVar1 * dVar2 * this->k4_ +
       this->k3_ * dVar2 + this->k2_ * dVar3 + this->k1_ * dVar1 + this->k0_;
  *dVdTheta = this->k4_ * 4.0 * dVar2 +
              this->k3_ * 3.0 * dVar3 + (this->k2_ + this->k2_) * dVar1 + this->k1_;
  return;
}

Assistant:

virtual void calcForce(RealType theta, RealType& V, RealType& dVdTheta) {
      RealType delta  = theta - theta0_;
      RealType delta2 = delta * delta;
      RealType delta3 = delta2 * delta;
      RealType delta4 = delta3 * delta;

      V = k0_ + k1_ * delta + k2_ * delta2 + k3_ * delta3 + k4_ * delta4;
      dVdTheta =
          k1_ + 2.0 * k2_ * delta + 3.0 * k3_ * delta2 + 4.0 * k4_ * delta3;
    }